

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall capnp::SchemaLoader::SchemaLoader(SchemaLoader *this,LazyLoadCallback *callback)

{
  Own<capnp::SchemaLoader::Impl> local_20;
  
  kj::
  heap<capnp::SchemaLoader::Impl,capnp::SchemaLoader&,capnp::SchemaLoader::LazyLoadCallback_const&>
            ((kj *)&local_20,this,callback);
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>>::
  MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>>
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>> *)this,&local_20);
  if (local_20.ptr != (Impl *)0x0) {
    local_20.ptr = (Impl *)0x0;
    (**(local_20.disposer)->_vptr_Disposer)();
  }
  return;
}

Assistant:

SchemaLoader::SchemaLoader(const LazyLoadCallback& callback)
    : impl(kj::heap<Impl>(*this, callback)) {}